

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O1

void od_ec_enc_reset(od_ec_enc *enc)

{
  enc->offs = 0;
  enc->low = 0;
  enc->rng = 0x8000;
  enc->cnt = -9;
  enc->error = 0;
  return;
}

Assistant:

void od_ec_enc_reset(od_ec_enc *enc) {
  enc->offs = 0;
  enc->low = 0;
  enc->rng = 0x8000;
  /*This is initialized to -9 so that it crosses zero after we've accumulated
     one byte + one carry bit.*/
  enc->cnt = -9;
  enc->error = 0;
#if OD_MEASURE_EC_OVERHEAD
  enc->entropy = 0;
  enc->nb_symbols = 0;
#endif
}